

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringLifting.cpp
# Opt level: O2

void __thiscall
wasm::StringLifting::run(wasm::Module*)::StringApplier::visitFunction(wasm::Function__
          (void *this,Function *curr)

{
  ReFinalize local_180;
  
  if (*(char *)((long)this + 0x138) == '\x01') {
    ReFinalize::ReFinalize(&local_180);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walkFunctionInModule
              (&local_180.
                super_WalkerPass<wasm::PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>_>
                .
                super_PostWalker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>
                .super_Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>,
               curr,*(Module **)((long)this + 0x128));
    ReFinalize::~ReFinalize(&local_180);
  }
  return;
}

Assistant:

void visitFunction(Function* curr) {
        // If we made modifications then we need to refinalize, as we replace
        // externrefs with stringrefs, a subtype.
        if (modified) {
          ReFinalize().walkFunctionInModule(curr, getModule());
        }
      }